

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzFind.cpp
# Opt level: O1

UInt32 crnlib::Bt4_MatchFinder_GetMatches(CMatchFinder *p,UInt32 *distances)

{
  uint lenLimit;
  CLzRef CVar1;
  CLzRef CVar2;
  byte *pbVar3;
  CLzRef *pCVar4;
  UInt32 UVar5;
  UInt32 *pUVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  UInt32 UVar11;
  ulong uVar12;
  bool bVar13;
  
  lenLimit = p->lenLimit;
  if (lenLimit < 4) {
    MatchFinder_MovePos(p);
    return 0;
  }
  pbVar3 = p->buffer;
  uVar7 = (uint)pbVar3[1] ^ p->crc[*pbVar3];
  uVar8 = (uint)pbVar3[2] << 8 ^ uVar7;
  uVar10 = (ulong)(uVar8 & 0xffff);
  UVar11 = p->pos;
  pCVar4 = p->hash;
  uVar12 = (ulong)((uVar7 & 0x3ff) << 2);
  CVar1 = *(CLzRef *)((long)pCVar4 + uVar12);
  uVar7 = UVar11 - CVar1;
  CVar2 = pCVar4[uVar10 + 0x400];
  uVar8 = ((p->crc[pbVar3[3]] << 5 ^ uVar8) & p->hashMask) + 0x10400;
  UVar5 = pCVar4[uVar8];
  pCVar4[uVar8] = UVar11;
  p->hash[uVar10 + 0x400] = UVar11;
  *(UInt32 *)((long)p->hash + uVar12) = UVar11;
  uVar8 = 1;
  uVar12 = 0;
  if ((uVar7 < p->cyclicBufferSize) && (pbVar3[-(ulong)uVar7] == *pbVar3)) {
    *distances = 2;
    distances[1] = uVar7 - 1;
    uVar12 = 2;
    uVar8 = 2;
  }
  if (((CVar2 != CVar1) && (uVar9 = UVar11 - CVar2, uVar9 < p->cyclicBufferSize)) &&
     (pbVar3[-(ulong)uVar9] == *pbVar3)) {
    distances[uVar12 + 1] = uVar9 - 1;
    uVar12 = (ulong)((int)uVar12 + 2);
    uVar8 = 3;
    uVar7 = uVar9;
  }
  UVar11 = (UInt32)uVar12;
  if (UVar11 == 0) {
LAB_001b04b4:
    UVar11 = 3;
    if (3 < uVar8) {
      UVar11 = uVar8;
    }
    pUVar6 = GetMatchesSpec1(lenLimit,UVar5,p->pos,p->buffer,p->son,p->cyclicBufferPos,
                             p->cyclicBufferSize,p->cutValue,distances + uVar12,UVar11);
    UVar11 = (UInt32)((ulong)((long)pUVar6 - (long)distances) >> 2);
  }
  else {
    bVar13 = uVar8 == lenLimit;
    uVar9 = uVar8;
    if (bVar13) {
LAB_001b04fa:
      distances[UVar11 - 2] = uVar9;
    }
    else {
      if (pbVar3[(ulong)uVar8 - (ulong)uVar7] == pbVar3[uVar8]) {
        do {
          uVar8 = uVar8 + 1;
          bVar13 = lenLimit == uVar8;
          uVar9 = lenLimit;
          if (bVar13) goto LAB_001b04fa;
        } while (pbVar3[(ulong)uVar8 - (ulong)uVar7] == pbVar3[uVar8]);
      }
      distances[UVar11 - 2] = uVar8;
      if (!bVar13) goto LAB_001b04b4;
    }
    SkipMatchesSpec(lenLimit,UVar5,p->pos,p->buffer,p->son,p->cyclicBufferPos,p->cyclicBufferSize,
                    p->cutValue);
  }
  p->cyclicBufferPos = p->cyclicBufferPos + 1;
  p->buffer = p->buffer + 1;
  UVar5 = p->pos + 1;
  p->pos = UVar5;
  if (UVar5 == p->posLimit) {
    MatchFinder_CheckLimits(p);
  }
  return UVar11;
}

Assistant:

static UInt32 Bt4_MatchFinder_GetMatches(CMatchFinder* p, UInt32* distances) {
  UInt32 hash2Value, hash3Value, delta2, delta3, maxLen, offset;
  GET_MATCHES_HEADER(4)

  HASH4_CALC;

  delta2 = p->pos - p->hash[hash2Value];
  delta3 = p->pos - p->hash[kFix3HashSize + hash3Value];
  curMatch = p->hash[kFix4HashSize + hashValue];

  p->hash[hash2Value] =
      p->hash[kFix3HashSize + hash3Value] =
          p->hash[kFix4HashSize + hashValue] = p->pos;

  maxLen = 1;
  offset = 0;
  if (delta2 < p->cyclicBufferSize && *(cur - delta2) == *cur) {
    distances[0] = maxLen = 2;
    distances[1] = delta2 - 1;
    offset = 2;
  }
  if (delta2 != delta3 && delta3 < p->cyclicBufferSize && *(cur - delta3) == *cur) {
    maxLen = 3;
    distances[offset + 1] = delta3 - 1;
    offset += 2;
    delta2 = delta3;
  }
  if (offset != 0) {
    for (; maxLen != lenLimit; maxLen++)
      if (cur[(ptrdiff_t)maxLen - delta2] != cur[maxLen])
        break;
    distances[offset - 2] = maxLen;
    if (maxLen == lenLimit) {
      SkipMatchesSpec(lenLimit, curMatch, MF_PARAMS(p));
      MOVE_POS_RET;
    }
  }
  if (maxLen < 3)
    maxLen = 3;
  GET_MATCHES_FOOTER(offset, maxLen)
}